

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O1

Promise<kj::OneOf<kj::HttpHeaders::Response,_kj::HttpHeaders::ProtocolError>_> __thiscall
kj::anon_unknown_36::HttpInputStreamImpl::readResponseHeaders(HttpInputStreamImpl *this)

{
  Coroutine<kj::OneOf<kj::HttpHeaders::Response,_kj::HttpHeaders::ProtocolError>_> *this_00;
  HttpInputStreamImpl *this_01;
  PromiseAwaiter<kj::OneOf<kj::ArrayPtr<char>,_kj::HttpHeaders::ProtocolError>_>
  *__return_storage_ptr__;
  OneOf<kj::ArrayPtr<char>,_kj::HttpHeaders::ProtocolError> *__return_storage_ptr___00;
  PromiseArenaMember *node;
  long lVar1;
  SourceLocation location;
  bool bVar2;
  bool bVar3;
  coroutine_handle<void> coroutine;
  undefined8 *puVar4;
  StringPtr *header;
  undefined8 *puVar5;
  FixVoid<kj::OneOf<kj::HttpHeaders::Response,_kj::HttpHeaders::ProtocolError>_>
  *__return_storage_ptr___01;
  undefined8 in_RSI;
  
  coroutine._M_fr_ptr = operator_new(0x548);
  *(code **)coroutine._M_fr_ptr = readResponseHeaders;
  *(code **)((long)coroutine._M_fr_ptr + 8) = readResponseHeaders;
  this_00 = (Coroutine<kj::OneOf<kj::HttpHeaders::Response,_kj::HttpHeaders::ProtocolError>_> *)
            ((long)coroutine._M_fr_ptr + 0x10);
  *(undefined8 *)((long)coroutine._M_fr_ptr + 0x538) = in_RSI;
  *(undefined ***)((long)coroutine._M_fr_ptr + 0x10) = &PTR_destroy_00642558;
  *(undefined ***)((long)coroutine._M_fr_ptr + 0x20) = &PTR_traceEvent_006425a0;
  location.function = "readResponseHeaders";
  location.fileName =
       "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++"
  ;
  location.lineNumber = 0x640;
  location.columnNumber = 0x3c;
  kj::_::CoroutineBase::CoroutineBase
            ((CoroutineBase *)this_00,coroutine,
             (ExceptionOrValue *)((long)coroutine._M_fr_ptr + 0x98),location);
  this_01 = (HttpInputStreamImpl *)((long)coroutine._M_fr_ptr + 0x530);
  *(undefined ***)((long)coroutine._M_fr_ptr + 0x10) = &PTR_destroy_00642558;
  *(undefined ***)((long)coroutine._M_fr_ptr + 0x20) = &PTR_traceEvent_006425a0;
  *(undefined1 *)((long)coroutine._M_fr_ptr + 0x98) = 0;
  *(undefined1 *)((long)coroutine._M_fr_ptr + 0x230) = 0;
  (this->super_HttpInputStream)._vptr_HttpInputStream = (_func_int **)this_00;
  readMessageHeaders(this_01);
  __return_storage_ptr__ =
       (PromiseAwaiter<kj::OneOf<kj::ArrayPtr<char>,_kj::HttpHeaders::ProtocolError>_> *)
       ((long)coroutine._M_fr_ptr + 0x278);
  co_await<kj::OneOf<kj::ArrayPtr<char>,kj::HttpHeaders::ProtocolError>>
            (__return_storage_ptr__,
             (Promise<kj::OneOf<kj::ArrayPtr<char>,_kj::HttpHeaders::ProtocolError>_> *)this_01);
  *(undefined1 *)((long)coroutine._M_fr_ptr + 0x540) = 0;
  bVar3 = kj::_::PromiseAwaiterBase::awaitSuspendImpl
                    ((PromiseAwaiterBase *)__return_storage_ptr__,(CoroutineBase *)this_00);
  if (bVar3) {
    return (PromiseBase)(PromiseBase)this;
  }
  __return_storage_ptr___00 =
       (OneOf<kj::ArrayPtr<char>,_kj::HttpHeaders::ProtocolError> *)
       ((long)coroutine._M_fr_ptr + 0x470);
  kj::_::PromiseAwaiter<kj::OneOf<kj::ArrayPtr<char>,_kj::HttpHeaders::ProtocolError>_>::
  await_resume(__return_storage_ptr___00,__return_storage_ptr__);
  if (*(char *)((long)coroutine._M_fr_ptr + 0x428) == '\x01') {
    if (*(int *)((long)coroutine._M_fr_ptr + 0x430) == 1) {
      *(undefined4 *)((long)coroutine._M_fr_ptr + 0x430) = 0;
    }
    if (*(int *)((long)coroutine._M_fr_ptr + 0x430) == 2) {
      *(undefined4 *)((long)coroutine._M_fr_ptr + 0x430) = 0;
    }
  }
  if (*(char *)((long)coroutine._M_fr_ptr + 0x290) == '\x01') {
    Exception::~Exception((Exception *)((long)coroutine._M_fr_ptr + 0x298));
  }
  kj::_::PromiseAwaiterBase::~PromiseAwaiterBase((PromiseAwaiterBase *)__return_storage_ptr__);
  node = (PromiseArenaMember *)(this_01->super_HttpInputStream)._vptr_HttpInputStream;
  if (node != (PromiseArenaMember *)0x0) {
    (this_01->super_HttpInputStream)._vptr_HttpInputStream = (_func_int **)0x0;
    kj::_::PromiseDisposer::dispose(node);
  }
  if (__return_storage_ptr___00->tag == 1) {
    __return_storage_ptr___01 =
         (FixVoid<kj::OneOf<kj::HttpHeaders::Response,_kj::HttpHeaders::ProtocolError>_> *)
         ((long)coroutine._M_fr_ptr + 0x4f0);
    lVar1 = *(long *)((long)coroutine._M_fr_ptr + 0x538);
    if (*(long *)(lVar1 + 0x58) != 0) {
      puVar5 = *(undefined8 **)(lVar1 + 0x50);
      puVar4 = puVar5 + *(long *)(lVar1 + 0x58) * 2;
      do {
        *puVar5 = "";
        puVar5[1] = 1;
        puVar5 = puVar5 + 2;
      } while (puVar5 != puVar4);
    }
    *(undefined8 *)(*(long *)((long)coroutine._M_fr_ptr + 0x538) + 0x70) =
         *(undefined8 *)(*(long *)((long)coroutine._M_fr_ptr + 0x538) + 0x68);
    HttpHeaders::tryParseResponse
              (__return_storage_ptr___01,(HttpHeaders *)(lVar1 + 0x48),
               *(ArrayPtr<char> *)((long)coroutine._M_fr_ptr + 0x478));
    kj::_::Coroutine<kj::OneOf<kj::HttpHeaders::Response,_kj::HttpHeaders::ProtocolError>_>::fulfill
              (this_00,__return_storage_ptr___01);
  }
  else {
    if (__return_storage_ptr___00->tag != 2) {
      bVar3 = true;
      bVar2 = false;
      goto LAB_003ab3cf;
    }
    __return_storage_ptr___01 =
         (FixVoid<kj::OneOf<kj::HttpHeaders::Response,_kj::HttpHeaders::ProtocolError>_> *)
         ((long)coroutine._M_fr_ptr + 0x4b0);
    *(undefined4 *)((long)coroutine._M_fr_ptr + 0x4b0) = 2;
    *(undefined8 *)((long)coroutine._M_fr_ptr + 0x4b8) =
         *(undefined8 *)((long)coroutine._M_fr_ptr + 0x478);
    *(undefined8 *)((long)coroutine._M_fr_ptr + 0x4c0) =
         *(undefined8 *)((long)coroutine._M_fr_ptr + 0x480);
    *(undefined8 *)((long)coroutine._M_fr_ptr + 0x4c8) =
         *(undefined8 *)((long)coroutine._M_fr_ptr + 0x488);
    *(undefined8 *)((long)coroutine._M_fr_ptr + 0x4d0) =
         *(undefined8 *)((long)coroutine._M_fr_ptr + 0x490);
    *(undefined8 *)((long)coroutine._M_fr_ptr + 0x4d8) =
         *(undefined8 *)((long)coroutine._M_fr_ptr + 0x498);
    *(undefined8 *)((long)coroutine._M_fr_ptr + 0x4e0) =
         *(undefined8 *)((long)coroutine._M_fr_ptr + 0x4a0);
    *(undefined8 *)((long)coroutine._M_fr_ptr + 0x4e8) =
         *(undefined8 *)((long)coroutine._M_fr_ptr + 0x4a8);
    kj::_::Coroutine<kj::OneOf<kj::HttpHeaders::Response,_kj::HttpHeaders::ProtocolError>_>::fulfill
              (this_00,__return_storage_ptr___01);
  }
  if (__return_storage_ptr___01->tag == 1) {
    __return_storage_ptr___01->tag = 0;
  }
  if (__return_storage_ptr___01->tag == 2) {
    __return_storage_ptr___01->tag = 0;
  }
  bVar2 = true;
  bVar3 = false;
LAB_003ab3cf:
  if (!bVar3) {
    if (__return_storage_ptr___00->tag == 1) {
      __return_storage_ptr___00->tag = 0;
    }
    if (__return_storage_ptr___00->tag == 2) {
      __return_storage_ptr___00->tag = 0;
    }
    if (bVar2) {
      *(undefined8 *)coroutine._M_fr_ptr = 0;
      *(undefined1 *)((long)coroutine._M_fr_ptr + 0x540) = 1;
    }
    else {
      if (*(char *)((long)coroutine._M_fr_ptr + 0x230) == '\x01') {
        if (*(int *)((long)coroutine._M_fr_ptr + 0x238) == 1) {
          *(undefined4 *)((long)coroutine._M_fr_ptr + 0x238) = 0;
        }
        if (*(int *)((long)coroutine._M_fr_ptr + 0x238) == 2) {
          *(undefined4 *)((long)coroutine._M_fr_ptr + 0x238) = 0;
        }
      }
      if ((((ExceptionOrValue *)((long)coroutine._M_fr_ptr + 0x98))->exception).ptr.isSet == true) {
        Exception::~Exception((Exception *)((long)coroutine._M_fr_ptr + 0xa0));
      }
      kj::_::CoroutineBase::~CoroutineBase((CoroutineBase *)this_00);
      operator_delete(coroutine._M_fr_ptr,0x548);
    }
    return (PromiseBase)(PromiseBase)this;
  }
  kj::_::unreachable();
}

Assistant:

inline kj::Promise<HttpHeaders::ResponseOrProtocolError> readResponseHeaders() {
    // Note: readResponseHeaders() could be called multiple times concurrently when pipelining
    //   requests. readMessageHeaders() will serialize these, but it's important not to mess with
    //   state (like calling headers.clear()) before said serialization has taken place.
    auto headersOrError = co_await readMessageHeaders();
    KJ_SWITCH_ONEOF(headersOrError) {
      KJ_CASE_ONEOF(protocolError, HttpHeaders::ProtocolError) {
        co_return protocolError;
      }
      KJ_CASE_ONEOF(text, kj::ArrayPtr<char>) {
        headers.clear();
        co_return headers.tryParseResponse(text);
      }
    }

    KJ_UNREACHABLE;
  }